

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

int Ver_ParseLookupSuffix(Ver_Man_t *pMan,char *pWord,int *pnMsb,int *pnLsb)

{
  int iVar1;
  undefined8 in_RAX;
  uint Value;
  
  Value = (uint)((ulong)in_RAX >> 0x20);
  *pnLsb = -1;
  *pnMsb = -1;
  if ((pMan->tName2Suffix != (st__table *)0x0) &&
     (iVar1 = st__lookup(pMan->tName2Suffix,pWord,(char **)&Value), iVar1 != 0)) {
    *pnMsb = Value >> 8 & 0xff;
    *pnLsb = Value & 0xff;
  }
  return 1;
}

Assistant:

int Ver_ParseLookupSuffix( Ver_Man_t * pMan, char * pWord, int * pnMsb, int * pnLsb )
{
    unsigned Value;
    *pnMsb = *pnLsb = -1;
    if ( pMan->tName2Suffix == NULL )
        return 1;
    if ( ! st__lookup( pMan->tName2Suffix, (char *)pWord, (char **)&Value ) )
        return 1;
    *pnMsb = (Value >> 8) & 0xff;
    *pnLsb = Value & 0xff;
    return 1;
}